

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_regex.hpp
# Opt level: O3

void __thiscall iutest::detail::iuRegex::iuRegex(iuRegex *this,string *pattern)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  
  (this->m_re)._M_flags = 0x10;
  std::locale::locale(&(this->m_re)._M_loc);
  (this->m_re)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_re)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_pattern)._M_dataplus._M_p = (pointer)&(this->m_pattern).field_2;
  (this->m_pattern)._M_string_length = 0;
  (this->m_pattern).field_2._M_local_buf[0] = '\0';
  __s = (pattern->_M_dataplus)._M_p;
  sVar2 = strlen(__s);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
            (&this->m_re,__s,__s + sVar2,0x10);
  pcVar1 = (char *)(this->m_pattern)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->m_pattern,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

iuRegex(const char* pattern) { Init(pattern); }